

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmIntegerLiteral(ExpressionContext *ctx,VmModule *module,ExprIntegerLiteral *node)

{
  TypeBase *pTVar1;
  VmConstant *value;
  VmValue *pVVar2;
  int value_00;
  SynBase *source;
  Allocator *allocator;
  
  pTVar1 = (node->super_ExprBase).type;
  if (pTVar1 == ctx->typeShort) {
    allocator = module->allocator;
    source = (node->super_ExprBase).source;
    value_00 = (int)(short)node->value;
  }
  else {
    if (pTVar1 != ctx->typeInt) {
      if (pTVar1 == ctx->typeLong) {
        value = CreateConstantLong(module->allocator,(node->super_ExprBase).source,node->value);
        goto LAB_00198bd4;
      }
      if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x19)) {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xa00,
                      "VmValue *CompileVmIntegerLiteral(ExpressionContext &, VmModule *, ExprIntegerLiteral *)"
                     );
      }
    }
    allocator = module->allocator;
    source = (node->super_ExprBase).source;
    value_00 = (int)node->value;
  }
  value = CreateConstantInt(allocator,source,value_00);
LAB_00198bd4:
  pVVar2 = anon_unknown.dwarf_10d873::CheckType(ctx,&node->super_ExprBase,&value->super_VmValue);
  return pVVar2;
}

Assistant:

VmValue* CompileVmIntegerLiteral(ExpressionContext &ctx, VmModule *module, ExprIntegerLiteral *node)
{
	if(node->type == ctx.typeShort)
		return CheckType(ctx, node, CreateConstantInt(module->allocator, node->source, short(node->value)));

	if(node->type == ctx.typeInt)
		return CheckType(ctx, node, CreateConstantInt(module->allocator, node->source, int(node->value)));

	if(node->type == ctx.typeLong)
		return CheckType(ctx, node, CreateConstantLong(module->allocator, node->source, node->value));

	if(isType<TypeEnum>(node->type))
		return CheckType(ctx, node, CreateConstantInt(module->allocator, node->source, int(node->value)));

	assert(!"unknown type");
	return NULL;
}